

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
libcellml::Units::addUnit
          (Units *this,string *reference,int prefix,double exponent,double multiplier,string *id)

{
  string local_58;
  string *local_38;
  string *id_local;
  double multiplier_local;
  double exponent_local;
  string *psStack_18;
  int prefix_local;
  string *reference_local;
  Units *this_local;
  
  local_38 = id;
  id_local = (string *)multiplier;
  multiplier_local = exponent;
  exponent_local._4_4_ = prefix;
  psStack_18 = reference;
  reference_local = (string *)this;
  convertToString_abi_cxx11_(&local_58,(libcellml *)(ulong)(uint)prefix,prefix);
  addUnit(this,reference,&local_58,multiplier_local,(double)id_local,local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void Units::addUnit(const std::string &reference, int prefix, double exponent,
                    double multiplier, const std::string &id)
{
    addUnit(reference, convertToString(prefix), exponent, multiplier, id);
}